

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O1

CSampleHandle __thiscall CSound::LoadWV(CSound *this,char *pFilename)

{
  int iVar1;
  uint32_t samples;
  uint uVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  WavpackContext *wpc;
  int32_t *buffer;
  short *psVar4;
  CSample *pCVar5;
  long lVar6;
  uint SampleID;
  int SampleID_00;
  ulong uVar7;
  long in_FS_OFFSET;
  char aError [100];
  char local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SampleID_00 = -1;
  if (((this->m_pConfig->m_DbgStress != 0) || (this->m_SoundEnabled == 0)) ||
     (this->m_pStorage == (IStorage *)0x0)) goto LAB_001301e5;
  lock_wait(m_SoundLock);
  SampleID_00 = -1;
  iVar1 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                    (this->m_pStorage,pFilename,1,0xffffffff,0,0,0,0);
  s_File = (IOHANDLE)CONCAT44(extraout_var,iVar1);
  if (s_File == (IOHANDLE)0x0) {
    dbg_msg("sound/wv","failed to open file. filename=\'%s\'",pFilename);
  }
  else {
    pCVar5 = m_aSamples;
    uVar7 = 0;
    do {
      if (pCVar5->m_pData == (short *)0x0) goto LAB_0012fffe;
      uVar7 = uVar7 + 1;
      pCVar5 = pCVar5 + 1;
    } while (uVar7 != 0x200);
    uVar7 = 0xffffffff;
LAB_0012fffe:
    SampleID_00 = (int)uVar7;
    if (-1 < SampleID_00) {
      wpc = WavpackOpenFileInput(ReadDataOld,local_a8);
      if (wpc == (WavpackContext *)0x0) {
        dbg_msg("sound/wv","failed to open %s: %s",pFilename,local_a8);
LAB_00130160:
        io_close(s_File);
        s_File = (IOHANDLE)0x0;
        if (this->m_pConfig->m_Debug != 0) {
          dbg_msg("sound/wv","loaded %s",pFilename);
        }
        RateConvert(SampleID_00);
        goto LAB_001301d9;
      }
      uVar7 = uVar7 & 0xffffffff;
      samples = WavpackGetNumSamples(wpc);
      uVar2 = WavpackGetBitsPerSample(wpc);
      uVar3 = WavpackGetSampleRate(wpc);
      iVar1 = WavpackGetNumChannels(wpc);
      m_aSamples[uVar7].m_Channels = iVar1;
      m_aSamples[uVar7].m_Rate = uVar3;
      if (iVar1 < 3) {
        if (uVar2 == 0x10) {
          iVar1 = iVar1 * samples;
          buffer = (int32_t *)mem_alloc(iVar1 * 4);
          WavpackUnpackSamples(wpc,buffer,samples);
          psVar4 = (short *)mem_alloc(iVar1 * 2);
          m_aSamples[uVar7].m_pData = psVar4;
          if (0 < iVar1) {
            lVar6 = 0;
            do {
              psVar4[lVar6] = (short)buffer[lVar6];
              lVar6 = lVar6 + 1;
            } while (iVar1 != (int)lVar6);
          }
          mem_free(buffer);
          m_aSamples[uVar7].m_NumFrames = samples;
          m_aSamples[uVar7].m_LoopStart = -1;
          m_aSamples[uVar7].m_LoopEnd = -1;
          m_aSamples[uVar7].m_PausedAt = 0;
          goto LAB_00130160;
        }
        dbg_msg("sound/wv","bps is %d, not 16, filname=\'%s\'",(ulong)uVar2,pFilename);
      }
      else {
        dbg_msg("sound/wv","file is not mono or stereo. filename=\'%s\'",pFilename);
      }
    }
    io_close(s_File);
    s_File = (IOHANDLE)0x0;
    SampleID_00 = -1;
  }
LAB_001301d9:
  lock_unlock(m_SoundLock);
LAB_001301e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (CSampleHandle)SampleID_00;
}

Assistant:

ISound::CSampleHandle CSound::LoadWV(const char *pFilename)
{
	CSample *pSample;
	int SampleID = -1;
	char aError[100];
	WavpackContext *pContext;

	// don't waste memory on sound when we are stress testing
	if(m_pConfig->m_DbgStress)
		return CSampleHandle();

	// no need to load sound when we are running with no sound
	if(!m_SoundEnabled)
		return CSampleHandle();

	if(!m_pStorage)
		return CSampleHandle();

	lock_wait(m_SoundLock);
	s_File = m_pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!s_File)
	{
		dbg_msg("sound/wv", "failed to open file. filename='%s'", pFilename);
		lock_unlock(m_SoundLock);
		return CSampleHandle();
	}

	SampleID = AllocID();
	if(SampleID < 0)
	{
		io_close(s_File);
		s_File = 0;
		lock_unlock(m_SoundLock);
		return CSampleHandle();
	}
	pSample = &m_aSamples[SampleID];

#if defined(CONF_WAVPACK_OPEN_FILE_INPUT_EX)
	WavpackStreamReader Callback = {0};
	Callback.can_seek = ReturnFalse;
	Callback.get_length = GetLength;
	Callback.get_pos = GetPos;
	Callback.push_back_byte = PushBackByte;
	Callback.read_bytes = ReadData;
	pContext = WavpackOpenFileInputEx(&Callback, (void *)1, 0, aError, 0, 0);
#else
	pContext = WavpackOpenFileInput(ReadDataOld, aError);
#endif
	if (pContext)
	{
		int m_aSamples = WavpackGetNumSamples(pContext);
		int BitsPerSample = WavpackGetBitsPerSample(pContext);
		unsigned int SampleRate = WavpackGetSampleRate(pContext);
		int m_aChannels = WavpackGetNumChannels(pContext);
		int *pData;
		int *pSrc;
		short *pDst;
		int i;

		pSample->m_Channels = m_aChannels;
		pSample->m_Rate = SampleRate;

		if(pSample->m_Channels > 2)
		{
			dbg_msg("sound/wv", "file is not mono or stereo. filename='%s'", pFilename);
			io_close(s_File);
			s_File = 0;
			lock_unlock(m_SoundLock);
			return CSampleHandle();
		}

		/*
		if(snd->rate != 44100)
		{
			dbg_msg("sound/wv", "file is %d Hz, not 44100 Hz. filename='%s'", snd->rate, filename);
			return -1;
		}*/

		if(BitsPerSample != 16)
		{
			dbg_msg("sound/wv", "bps is %d, not 16, filname='%s'", BitsPerSample, pFilename);
			io_close(s_File);
			s_File = 0;
			lock_unlock(m_SoundLock);
			return CSampleHandle();
		}

		pData = (int *)mem_alloc(4*m_aSamples*m_aChannels);
		WavpackUnpackSamples(pContext, pData, m_aSamples); // TODO: check return value
		pSrc = pData;

		pSample->m_pData = (short *)mem_alloc(2*m_aSamples*m_aChannels);
		pDst = pSample->m_pData;

		for (i = 0; i < m_aSamples*m_aChannels; i++)
			*pDst++ = (short)*pSrc++;

		mem_free(pData);

		pSample->m_NumFrames = m_aSamples;
		pSample->m_LoopStart = -1;
		pSample->m_LoopEnd = -1;
		pSample->m_PausedAt = 0;
	}
	else
	{
		dbg_msg("sound/wv", "failed to open %s: %s", pFilename, aError);
	}

	io_close(s_File);
	s_File = NULL;

	if(m_pConfig->m_Debug)
		dbg_msg("sound/wv", "loaded %s", pFilename);

	RateConvert(SampleID);
	lock_unlock(m_SoundLock);
	return CreateSampleHandle(SampleID);
}